

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O1

LLVMValueRef
CompileLlvmFunctionContextAccess(LlvmCompilationContext *ctx,ExprFunctionContextAccess *node)

{
  SynIdentifier *pSVar1;
  char *__src;
  int iVar2;
  TypeBase *pTVar3;
  _func_int **pp_Var4;
  LLVMValueRefOpaque **ppLVar5;
  undefined4 extraout_var;
  LLVMValueRef pLVar6;
  ulong uVar7;
  
  pTVar3 = node->function->contextType;
  if ((pTVar3 == (TypeBase *)0x0) || (pTVar3->typeID != 0x12)) {
    pTVar3 = (TypeBase *)0x0;
  }
  if (pTVar3 == (TypeBase *)0x0) {
    __assert_fail("refType",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                  ,0x671,
                  "LLVMValueRef CompileLlvmFunctionContextAccess(LlvmCompilationContext &, ExprFunctionContextAccess *)"
                 );
  }
  pp_Var4 = pTVar3[1]._vptr_TypeBase;
  if ((pp_Var4 == (_func_int **)0x0) || (*(int *)(pp_Var4 + 1) != 0x18)) {
    pp_Var4 = (_func_int **)0x0;
  }
  if (pp_Var4 != (_func_int **)0x0) {
    if (pp_Var4[6] == (_func_int *)0x0) {
      CompileLlvmType(ctx,(node->super_ExprBase).type);
    }
    else {
      ppLVar5 = SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>
                ::find(&ctx->variables,&node->contextVariable->uniqueId);
      if (ppLVar5 == (LLVMValueRefOpaque **)0x0) {
        __assert_fail("variable",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                      ,0x681,
                      "LLVMValueRef CompileLlvmFunctionContextAccess(LlvmCompilationContext &, ExprFunctionContextAccess *)"
                     );
      }
      pSVar1 = node->contextVariable->name;
      __src = (pSVar1->name).begin;
      uVar7 = (long)(pSVar1->name).end - (long)__src;
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)((int)uVar7 + 1));
      uVar7 = uVar7 & 0xffffffff;
      memcpy((void *)CONCAT44(extraout_var,iVar2),__src,uVar7);
      *(undefined1 *)((long)CONCAT44(extraout_var,iVar2) + uVar7) = 0;
    }
    pLVar6 = CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)&placeholderValue);
    return pLVar6;
  }
  __assert_fail("classType",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                ,0x675,
                "LLVMValueRef CompileLlvmFunctionContextAccess(LlvmCompilationContext &, ExprFunctionContextAccess *)"
               );
}

Assistant:

LLVMValueRef CompileLlvmFunctionContextAccess(LlvmCompilationContext &ctx, ExprFunctionContextAccess *node)
{
	TypeRef *refType = getType<TypeRef>(node->function->contextType);

	assert(refType);

	TypeClass *classType = getType<TypeClass>(refType->subType);

	assert(classType);

	LLVMValueRef value = NULL;

	if(classType->size == 0)
	{
		value = LLVMConstPointerNull(CompileLlvmType(ctx, node->type));
	}
	else
	{
		LLVMValueRef *variable = ctx.variables.find(node->contextVariable->uniqueId);

		assert(variable);

		LLVMValueRef address = *variable;

		value = LLVMBuildLoad(ctx.builder, address, CreateLlvmName(ctx, node->contextVariable->name->name));
	}

	return CheckType(ctx, node, value);
}